

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O2

bool __thiscall miniros::observer::impl::Connections::isEmpty(Connections *this)

{
  Connection *pCVar1;
  
  std::recursive_mutex::lock(&this->m_mutex);
  pCVar1 = (this->m_root).m_next;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return pCVar1 == &this->m_root;
}

Assistant:

bool isEmpty() const {
        std::scoped_lock<mutex_t> lock(m_mutex);
        return m_root.m_next == &m_root;
    }